

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

vector<common_sampler_type,_std::allocator<common_sampler_type>_> *
common_sampler_types_from_chars
          (vector<common_sampler_type,_std::allocator<common_sampler_type>_> *__return_storage_ptr__
          ,string *chars)

{
  char cVar1;
  __node_base_ptr p_Var2;
  iterator __position;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  common_sampler_type *__args;
  __node_base_ptr p_Var5;
  char *c;
  char *pcVar6;
  char *pcVar7;
  unordered_map<char,_common_sampler_type,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_common_sampler_type>_>_>
  sampler_name_map;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  _Hashtable<char,_std::pair<const_char,_common_sampler_type>,_std::allocator<std::pair<const_char,_common_sampler_type>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_98;
  undefined1 local_60 [4];
  undefined4 local_5c;
  undefined1 local_58;
  undefined4 local_54;
  undefined1 local_50;
  undefined4 local_4c;
  undefined1 local_48;
  undefined4 local_44;
  undefined1 local_40;
  undefined4 local_3c;
  undefined1 local_38;
  undefined4 local_34;
  undefined1 local_30;
  undefined4 local_2c;
  undefined1 local_28;
  undefined4 local_24;
  undefined1 local_20;
  undefined4 local_1c;
  
  local_60[0] = 100;
  local_5c = 1;
  local_58 = 0x6b;
  local_54 = 2;
  local_50 = 0x79;
  local_4c = 6;
  local_48 = 0x70;
  local_44 = 3;
  local_40 = 0x6d;
  local_3c = 4;
  local_38 = 0x74;
  local_34 = 7;
  local_30 = 0x78;
  local_2c = 8;
  local_28 = 0x69;
  local_24 = 9;
  local_20 = 0x65;
  local_1c = 10;
  std::
  _Hashtable<char,std::pair<char_const,common_sampler_type>,std::allocator<std::pair<char_const,common_sampler_type>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<char_const,common_sampler_type>const*>
            ((_Hashtable<char,std::pair<char_const,common_sampler_type>,std::allocator<std::pair<char_const,common_sampler_type>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_98,local_60,&stack0xffffffffffffffe8,0,&local_99,&local_9a,&local_9b);
  (__return_storage_ptr__->
  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::reserve
            (__return_storage_ptr__,chars->_M_string_length);
  if (chars->_M_string_length != 0) {
    pcVar6 = (chars->_M_dataplus)._M_p;
    pcVar7 = pcVar6 + chars->_M_string_length;
    do {
      cVar1 = *pcVar6;
      p_Var2 = local_98._M_buckets[(ulong)(long)cVar1 % local_98._M_bucket_count];
      p_Var3 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var3 = p_Var2, p_Var5 = p_Var2->_M_nxt, cVar1 != *(char *)&p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var4 = p_Var5->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var3 = (__node_base_ptr)0x0;
          if (((ulong)(long)*(char *)&p_Var4[1]._M_nxt % local_98._M_bucket_count !=
               (ulong)(long)cVar1 % local_98._M_bucket_count) ||
             (p_Var3 = p_Var5, p_Var5 = p_Var4, cVar1 == *(char *)&p_Var4[1]._M_nxt))
          goto LAB_002398a8;
        }
        p_Var3 = (__node_base_ptr)0x0;
      }
LAB_002398a8:
      if (p_Var3 == (__node_base_ptr)0x0) {
        p_Var4 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var4 = p_Var3->_M_nxt;
      }
      if (p_Var4 != (_Hash_node_base *)0x0) {
        __args = (common_sampler_type *)((long)&p_Var4[1]._M_nxt + 4);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<common_sampler_type,std::allocator<common_sampler_type>>::
          _M_realloc_insert<common_sampler_type_const&>
                    ((vector<common_sampler_type,std::allocator<common_sampler_type>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          (__return_storage_ptr__->
          super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar7);
  }
  std::
  _Hashtable<char,_std::pair<const_char,_common_sampler_type>,_std::allocator<std::pair<const_char,_common_sampler_type>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<common_sampler_type> common_sampler_types_from_chars(const std::string & chars) {
    std::unordered_map<char, common_sampler_type> sampler_name_map = {
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_DRY),         COMMON_SAMPLER_TYPE_DRY },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_K),       COMMON_SAMPLER_TYPE_TOP_K },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TYPICAL_P),   COMMON_SAMPLER_TYPE_TYPICAL_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TOP_P),       COMMON_SAMPLER_TYPE_TOP_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_MIN_P),       COMMON_SAMPLER_TYPE_MIN_P },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_TEMPERATURE), COMMON_SAMPLER_TYPE_TEMPERATURE },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_XTC),         COMMON_SAMPLER_TYPE_XTC },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_INFILL),      COMMON_SAMPLER_TYPE_INFILL },
        { common_sampler_type_to_chr(COMMON_SAMPLER_TYPE_PENALTIES),   COMMON_SAMPLER_TYPE_PENALTIES },
    };

    std::vector<common_sampler_type> samplers;
    samplers.reserve(chars.size());

    for (const auto & c : chars) {
        const auto sampler = sampler_name_map.find(c);
        if (sampler != sampler_name_map.end()) {
            samplers.push_back(sampler->second);
        }
    }

    return samplers;
}